

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  undefined1 uVar1;
  stbi_uc sVar2;
  undefined2 uVar3;
  stbi__uint32 sVar4;
  int iVar5;
  stbi__uint32 x_00;
  int iVar6;
  int iVar7;
  stbi__uint32 sVar8;
  int iVar9;
  ushort *puVar10;
  byte *pbVar11;
  float fVar12;
  float fVar13;
  float inv_a_1;
  float ra_1;
  float a_1;
  uchar *pixel_1;
  float inv_a;
  float ra;
  float a;
  stbi__uint16 *pixel;
  stbi_uc *p_2;
  stbi__uint16 *q_1;
  stbi_uc *psStack_88;
  stbi_uc val_1;
  stbi_uc *p_1;
  stbi_uc *psStack_78;
  stbi__uint16 val;
  stbi__uint16 *q;
  stbi_uc *p;
  stbi_uc *out;
  int h;
  int w;
  int bitdepth;
  int i;
  int channel;
  int compression;
  int channelCount;
  int pixelCount;
  stbi__result_info *ri_local;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  sVar4 = stbi__get32be(s);
  if (sVar4 == 0x38425053) {
    iVar5 = stbi__get16be(s);
    if (iVar5 == 1) {
      stbi__skip(s,6);
      iVar5 = stbi__get16be(s);
      if ((iVar5 < 0) || (0x10 < iVar5)) {
        stbi__err("wrong channel count");
        s_local = (stbi__context *)0x0;
      }
      else {
        sVar4 = stbi__get32be(s);
        x_00 = stbi__get32be(s);
        if ((int)sVar4 < 0x1000001) {
          if ((int)x_00 < 0x1000001) {
            iVar6 = stbi__get16be(s);
            if ((iVar6 == 8) || (iVar6 == 0x10)) {
              iVar7 = stbi__get16be(s);
              if (iVar7 == 3) {
                sVar8 = stbi__get32be(s);
                stbi__skip(s,sVar8);
                sVar8 = stbi__get32be(s);
                stbi__skip(s,sVar8);
                sVar8 = stbi__get32be(s);
                stbi__skip(s,sVar8);
                iVar7 = stbi__get16be(s);
                if (iVar7 < 2) {
                  iVar9 = stbi__mad3sizes_valid(4,x_00,sVar4,0);
                  if (iVar9 == 0) {
                    stbi__err("too large");
                    s_local = (stbi__context *)0x0;
                  }
                  else {
                    if (((iVar7 == 0) && (iVar6 == 0x10)) && (bpc == 0x10)) {
                      p = (stbi_uc *)stbi__malloc_mad3(8,x_00,sVar4,0);
                      ri->bits_per_channel = 0x10;
                    }
                    else {
                      p = (stbi_uc *)stbi__malloc((long)(int)(x_00 * 4 * sVar4));
                    }
                    if (p == (stbi_uc *)0x0) {
                      stbi__err("outofmem");
                      s_local = (stbi__context *)0x0;
                    }
                    else {
                      iVar9 = x_00 * sVar4;
                      if (iVar7 == 0) {
                        for (bitdepth = 0; bitdepth < 4; bitdepth = bitdepth + 1) {
                          if (bitdepth < iVar5) {
                            if (ri->bits_per_channel == 0x10) {
                              p_2 = p + (long)bitdepth * 2;
                              for (w = 0; w < iVar9; w = w + 1) {
                                iVar7 = stbi__get16be(s);
                                *(short *)p_2 = (short)iVar7;
                                p_2 = p_2 + 8;
                              }
                            }
                            else {
                              pixel = (stbi__uint16 *)(p + bitdepth);
                              if (iVar6 == 0x10) {
                                for (w = 0; w < iVar9; w = w + 1) {
                                  iVar7 = stbi__get16be(s);
                                  *(char *)pixel = (char)((uint)iVar7 >> 8);
                                  pixel = pixel + 2;
                                }
                              }
                              else {
                                for (w = 0; w < iVar9; w = w + 1) {
                                  sVar2 = stbi__get8(s);
                                  *(stbi_uc *)pixel = sVar2;
                                  pixel = pixel + 2;
                                }
                              }
                            }
                          }
                          else if ((iVar6 == 0x10) && (bpc == 0x10)) {
                            psStack_78 = p + (long)bitdepth * 2;
                            uVar3 = 0;
                            if (bitdepth == 3) {
                              uVar3 = 0xffff;
                            }
                            for (w = 0; w < iVar9; w = w + 1) {
                              *(undefined2 *)psStack_78 = uVar3;
                              psStack_78 = psStack_78 + 8;
                            }
                          }
                          else {
                            psStack_88 = p + bitdepth;
                            sVar2 = '\0';
                            if (bitdepth == 3) {
                              sVar2 = 0xff;
                            }
                            for (w = 0; w < iVar9; w = w + 1) {
                              *psStack_88 = sVar2;
                              psStack_88 = psStack_88 + 4;
                            }
                          }
                        }
                      }
                      else {
                        stbi__skip(s,sVar4 * iVar5 * 2);
                        for (bitdepth = 0; bitdepth < 4; bitdepth = bitdepth + 1) {
                          q = (stbi__uint16 *)(p + bitdepth);
                          if (bitdepth < iVar5) {
                            iVar6 = stbi__psd_decode_rle(s,(stbi_uc *)q,iVar9);
                            if (iVar6 == 0) {
                              free(p);
                              stbi__err("corrupt");
                              return (void *)0x0;
                            }
                          }
                          else {
                            for (w = 0; w < iVar9; w = w + 1) {
                              uVar1 = 0;
                              if (bitdepth == 3) {
                                uVar1 = 0xff;
                              }
                              *(undefined1 *)q = uVar1;
                              q = q + 2;
                            }
                          }
                        }
                      }
                      if (3 < iVar5) {
                        if (ri->bits_per_channel == 0x10) {
                          for (w = 0; w < (int)(x_00 * sVar4); w = w + 1) {
                            puVar10 = (ushort *)(p + (long)(w << 2) * 2);
                            if ((puVar10[3] != 0) && (puVar10[3] != 0xffff)) {
                              fVar13 = 1.0 / ((float)puVar10[3] / 65535.0);
                              fVar12 = (1.0 - fVar13) * 65535.0;
                              *puVar10 = (ushort)(int)((float)*puVar10 * fVar13 + fVar12);
                              puVar10[1] = (ushort)(int)((float)puVar10[1] * fVar13 + fVar12);
                              puVar10[2] = (ushort)(int)((float)puVar10[2] * fVar13 + fVar12);
                            }
                          }
                        }
                        else {
                          for (w = 0; w < (int)(x_00 * sVar4); w = w + 1) {
                            pbVar11 = p + (w << 2);
                            if ((pbVar11[3] != 0) && (pbVar11[3] != 0xff)) {
                              fVar13 = 1.0 / ((float)pbVar11[3] / 255.0);
                              fVar12 = (1.0 - fVar13) * 255.0;
                              *pbVar11 = (byte)(int)((float)*pbVar11 * fVar13 + fVar12);
                              pbVar11[1] = (byte)(int)((float)pbVar11[1] * fVar13 + fVar12);
                              pbVar11[2] = (byte)(int)((float)pbVar11[2] * fVar13 + fVar12);
                            }
                          }
                        }
                      }
                      if ((req_comp != 0) && (req_comp != 4)) {
                        if (ri->bits_per_channel == 0x10) {
                          p = (stbi_uc *)
                              stbi__convert_format16((stbi__uint16 *)p,4,req_comp,x_00,sVar4);
                        }
                        else {
                          p = stbi__convert_format(p,4,req_comp,x_00,sVar4);
                        }
                        if (p == (stbi_uc *)0x0) {
                          return (void *)0x0;
                        }
                      }
                      if (comp != (int *)0x0) {
                        *comp = 4;
                      }
                      *y = sVar4;
                      *x = x_00;
                      s_local = (stbi__context *)p;
                    }
                  }
                }
                else {
                  stbi__err("bad compression");
                  s_local = (stbi__context *)0x0;
                }
              }
              else {
                stbi__err("wrong color format");
                s_local = (stbi__context *)0x0;
              }
            }
            else {
              stbi__err("unsupported bit depth");
              s_local = (stbi__context *)0x0;
            }
          }
          else {
            stbi__err("too large");
            s_local = (stbi__context *)0x0;
          }
        }
        else {
          stbi__err("too large");
          s_local = (stbi__context *)0x0;
        }
      }
    }
    else {
      stbi__err("wrong version");
      s_local = (stbi__context *)0x0;
    }
  }
  else {
    stbi__err("not PSD");
    s_local = (stbi__context *)0x0;
  }
  return s_local;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   if (h > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (w > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}